

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::VSliderScalar
               (char *label,ImVec2 *size,ImGuiDataType data_type,void *p_data,void *p_min,
               void *p_max,char *format,ImGuiSliderFlags flags)

{
  bool bVar1;
  int iVar2;
  ImGuiDataTypeInfo *pIVar3;
  ImGuiDataType in_EDX;
  uint data_type_00;
  float _x;
  char *in_stack_00000008;
  uint in_stack_00000010;
  char *value_buf_end;
  char value_buf [64];
  bool value_changed;
  ImRect grab_bb;
  ImU32 frame_col;
  bool hovered;
  ImRect bb;
  ImRect frame_bb;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  ImGuiID in_stack_fffffffffffffe54;
  ImRect *in_stack_fffffffffffffe58;
  char *buf;
  float in_stack_fffffffffffffe60;
  ImGuiCol in_stack_fffffffffffffe64;
  ImRect *in_stack_fffffffffffffe68;
  undefined1 *puVar4;
  ImGuiWindow *in_stack_fffffffffffffe70;
  ImGuiWindow *in_stack_fffffffffffffe78;
  ImVec2 *pIVar5;
  undefined8 in_stack_fffffffffffffe80;
  ImGuiID id_00;
  ImVec2 *text_size_if_known;
  ImDrawList *in_stack_fffffffffffffe88;
  undefined1 hide_text_after_hash;
  char *in_stack_fffffffffffffe90;
  ImVec2 *in_stack_fffffffffffffe98;
  float in_stack_fffffffffffffea0;
  float fVar6;
  ImRect *bb_00;
  undefined4 in_stack_fffffffffffffeb0;
  ImVec2 p_max_00;
  ImVec2 IVar7;
  ImGuiSliderFlags flags_00;
  ImRect *out_grab_bb;
  ImVec2 local_128;
  ImVec2 local_120;
  ImVec2 local_118;
  ImVec2 *local_110;
  float in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  ImRect *in_stack_ffffffffffffff00;
  char local_c0 [4];
  float local_bc;
  ImVec2 aIStack_b8 [3];
  ImU32 local_9c;
  undefined1 local_95;
  ImRect local_94;
  ImRect local_84;
  ImVec2 local_74;
  undefined1 local_6c [16];
  ImVec2 local_5c;
  ImGuiID local_54;
  ImGuiStyle *local_50;
  ImGuiContext *local_48;
  ImGuiWindow *local_40;
  ImGuiDataType local_1c;
  bool local_1;
  
  id_00 = (ImGuiID)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  local_1c = in_EDX;
  local_40 = GetCurrentWindow();
  if ((local_40->SkipItems & 1U) == 0) {
    local_48 = GImGui;
    local_50 = &GImGui->Style;
    p_max_00.x = 0.0;
    p_max_00.y = 0.0;
    local_54 = ImGuiWindow::GetID(in_stack_fffffffffffffe70,(char *)in_stack_fffffffffffffe68,
                                  (char *)CONCAT44(in_stack_fffffffffffffe64,
                                                   in_stack_fffffffffffffe60));
    local_5c = CalcTextSize((char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
                            SUB81((ulong)in_stack_fffffffffffffe68 >> 0x38,0),
                            SUB84(in_stack_fffffffffffffe68,0));
    IVar7 = (ImVec2)&local_40->DC;
    local_74 = operator+(in_stack_fffffffffffffe48,(ImVec2 *)0x194de6);
    ImRect::ImRect((ImRect *)local_6c,(ImVec2 *)IVar7,&local_74);
    pIVar5 = (ImVec2 *)local_6c;
    out_grab_bb = (ImRect *)(local_6c + 8);
    if (local_5c.x <= 0.0) {
      _x = 0.0;
    }
    else {
      _x = (local_50->ItemInnerSpacing).x + local_5c.x;
    }
    bb_00 = &local_94;
    ImVec2::ImVec2(&bb_00->Min,_x,0.0);
    local_94.Max = operator+(in_stack_fffffffffffffe48,(ImVec2 *)0x194e94);
    fVar6 = (float)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    ImRect::ImRect(&local_84,pIVar5,&local_94.Max);
    flags_00 = (ImGuiSliderFlags)pIVar5;
    ItemSize((ImRect *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),fVar6);
    bVar1 = ItemAdd((ImRect *)in_stack_fffffffffffffe78,
                    (ImGuiID)((ulong)in_stack_fffffffffffffe70 >> 0x20),in_stack_fffffffffffffe68);
    if (bVar1) {
      if (in_stack_00000008 == (char *)0x0) {
        pIVar3 = DataTypeGetInfo(local_1c);
        in_stack_00000008 = pIVar3->PrintFmt;
      }
      else if ((local_1c == 4) && (iVar2 = strcmp(in_stack_00000008,"%d"), iVar2 != 0)) {
        in_stack_00000008 = PatchFormatStringFloatToInt((char *)in_stack_fffffffffffffe58);
      }
      local_95 = ItemHoverable(in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      if (((((bool)local_95) && (((local_48->IO).MouseClicked[0] & 1U) != 0)) ||
          (local_48->NavActivateId == local_54)) || (local_48->NavInputId == local_54)) {
        SetActiveID(local_54,local_40);
        SetFocusID(id_00,in_stack_fffffffffffffe78);
        FocusWindow(in_stack_fffffffffffffe70);
        local_48->ActiveIdUsingNavDirMask = local_48->ActiveIdUsingNavDirMask | 0xc;
      }
      if (local_48->ActiveId == local_54) {
        fVar6 = 1.26117e-44;
      }
      else {
        fVar6 = 9.80909e-45;
        if (local_48->HoveredId == local_54) {
          fVar6 = 1.12104e-44;
        }
      }
      local_9c = GetColorU32(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
      RenderNavHighlight(in_stack_ffffffffffffff00,(ImGuiID)in_stack_fffffffffffffefc,
                         (ImGuiNavHighlightFlags)in_stack_fffffffffffffef8);
      RenderFrame(IVar7,p_max_00,(ImU32)_x,SUB41((uint)in_stack_fffffffffffffeb0 >> 0x18,0),
                  (float)((ulong)bb_00 >> 0x20));
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      data_type_00 = in_stack_00000010 | 0x100000;
      buf = local_c0;
      bVar1 = SliderBehavior(bb_00,(ImGuiID)fVar6,(ImGuiDataType)in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88,(char *)IVar7,flags_00,out_grab_bb);
      if (bVar1) {
        MarkItemEdited(local_54);
      }
      if (local_bc < aIStack_b8[0].y) {
        in_stack_fffffffffffffe88 = local_40->DrawList;
        in_stack_fffffffffffffe90 = local_c0;
        in_stack_fffffffffffffe98 = aIStack_b8;
        GetColorU32(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)in_stack_fffffffffffffe70,&in_stack_fffffffffffffe68->Min,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   (ImU32)((ulong)buf >> 0x20),SUB84(buf,0),in_stack_fffffffffffffe54);
      }
      puVar4 = &stack0xfffffffffffffef8;
      iVar2 = DataTypeFormatString
                        (buf,in_stack_fffffffffffffe54,data_type_00,in_stack_00000008,
                         (char *)0x195241);
      local_110 = (ImVec2 *)(puVar4 + iVar2);
      ImVec2::ImVec2(&local_118,(float)local_6c._0_4_,
                     (float)local_6c._4_4_ + (local_50->FramePadding).y);
      pIVar5 = (ImVec2 *)&stack0xfffffffffffffef8;
      text_size_if_known = local_110;
      ImVec2::ImVec2(&local_120,0.5,0.0);
      RenderTextClipped((ImVec2 *)CONCAT44(fVar6,in_stack_fffffffffffffea0),
                        in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                        (char *)in_stack_fffffffffffffe88,text_size_if_known,pIVar5,
                        (ImRect *)CONCAT44(_x,in_stack_fffffffffffffeb0));
      hide_text_after_hash = (undefined1)((ulong)in_stack_fffffffffffffe88 >> 0x38);
      local_1 = bVar1;
      if (0.0 < local_5c.x) {
        ImVec2::ImVec2(&local_128,(float)local_6c._8_4_ + (local_50->ItemInnerSpacing).x,
                       (float)local_6c._4_4_ + (local_50->FramePadding).y);
        IVar7.y = fVar6;
        IVar7.x = in_stack_fffffffffffffea0;
        RenderText(IVar7,(char *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                   (bool)hide_text_after_hash);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::VSliderScalar(const char* label, const ImVec2& size, ImGuiDataType data_type, void* p_data, const void* p_min, const void* p_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));

    ItemSize(bb, style.FramePadding.y);
    if (!ItemAdd(frame_bb, id))
        return false;

    // Default format string when passing NULL
    if (format == NULL)
        format = DataTypeGetInfo(data_type)->PrintFmt;
    else if (data_type == ImGuiDataType_S32 && strcmp(format, "%d") != 0) // (FIXME-LEGACY: Patch old "%.0f" format string to use "%d", read function more details.)
        format = PatchFormatStringFloatToInt(format);

    const bool hovered = ItemHoverable(frame_bb, id);
    if ((hovered && g.IO.MouseClicked[0]) || g.NavActivateId == id || g.NavInputId == id)
    {
        SetActiveID(id, window);
        SetFocusID(id, window);
        FocusWindow(window);
        g.ActiveIdUsingNavDirMask |= (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
    }

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderNavHighlight(frame_bb, id);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, g.Style.FrameRounding);

    // Slider behavior
    ImRect grab_bb;
    const bool value_changed = SliderBehavior(frame_bb, id, data_type, p_data, p_min, p_max, format, flags | ImGuiSliderFlags_Vertical, &grab_bb);
    if (value_changed)
        MarkItemEdited(id);

    // Render grab
    if (grab_bb.Max.y > grab_bb.Min.y)
        window->DrawList->AddRectFilled(grab_bb.Min, grab_bb.Max, GetColorU32(g.ActiveId == id ? ImGuiCol_SliderGrabActive : ImGuiCol_SliderGrab), style.GrabRounding);

    // Display value using user-provided display format so user can add prefix/suffix/decorations to the value.
    // For the vertical slider we allow centered text to overlap the frame padding
    char value_buf[64];
    const char* value_buf_end = value_buf + DataTypeFormatString(value_buf, IM_ARRAYSIZE(value_buf), data_type, p_data, format);
    RenderTextClipped(ImVec2(frame_bb.Min.x, frame_bb.Min.y + style.FramePadding.y), frame_bb.Max, value_buf, value_buf_end, NULL, ImVec2(0.5f, 0.0f));
    if (label_size.x > 0.0f)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    return value_changed;
}